

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O0

UniValue * __thiscall CBanEntry::ToJson(CBanEntry *this)

{
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *json;
  UniValue *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  UniValue *in_stack_fffffffffffffe18;
  UniValue *val;
  UniValue *this_00;
  UniValue *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  allocator<char> local_193;
  allocator<char> local_192;
  allocator<char> local_191 [361];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniValue *)&stack0xffffffffffffffd8;
  val = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe10);
  UniValue::UniValue(in_stack_fffffffffffffe18,(VType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                     in_stack_fffffffffffffe08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,(allocator<char> *)this_00)
  ;
  UniValue::UniValue<const_int_&,_int,_true>(this_00,(int *)val);
  UniValue::pushKV(in_stack_fffffffffffffe40,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  std::allocator<char>::~allocator(local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,(allocator<char> *)this_00)
  ;
  UniValue::UniValue<const_long_&,_long,_true>(this_00,(long *)val);
  UniValue::pushKV(in_stack_fffffffffffffe40,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  std::allocator<char>::~allocator(&local_192);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,(allocator<char> *)this_00)
  ;
  UniValue::UniValue<const_long_&,_long,_true>(this_00,(long *)val);
  UniValue::pushKV(in_stack_fffffffffffffe40,(string *)this_00,val);
  UniValue::~UniValue(in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  std::allocator<char>::~allocator(&local_193);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue CBanEntry::ToJson() const
{
    UniValue json(UniValue::VOBJ);
    json.pushKV(BANMAN_JSON_VERSION_KEY, nVersion);
    json.pushKV("ban_created", nCreateTime);
    json.pushKV("banned_until", nBanUntil);
    return json;
}